

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O0

size_t FSE_writeNCount(void *buffer,size_t bufferSize,short *normalizedCounter,uint maxSymbolValue,
                      uint tableLog)

{
  size_t sVar1;
  uint tableLog_local;
  uint maxSymbolValue_local;
  short *normalizedCounter_local;
  size_t bufferSize_local;
  void *buffer_local;
  
  if (tableLog < 0xd) {
    if (tableLog < 5) {
      buffer_local = (void *)0xffffffffffffffff;
    }
    else {
      sVar1 = FSE_NCountWriteBound(maxSymbolValue,tableLog);
      if (bufferSize < sVar1) {
        buffer_local = (void *)FSE_writeNCount_generic
                                         (buffer,bufferSize,normalizedCounter,maxSymbolValue,
                                          tableLog,0);
      }
      else {
        buffer_local = (void *)FSE_writeNCount_generic
                                         (buffer,bufferSize,normalizedCounter,maxSymbolValue,
                                          tableLog,1);
      }
    }
  }
  else {
    buffer_local = (void *)0xffffffffffffffd4;
  }
  return (size_t)buffer_local;
}

Assistant:

size_t FSE_writeNCount (void* buffer, size_t bufferSize,
                  const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog)
{
    if (tableLog > FSE_MAX_TABLELOG) return ERROR(tableLog_tooLarge);   /* Unsupported */
    if (tableLog < FSE_MIN_TABLELOG) return ERROR(GENERIC);   /* Unsupported */

    if (bufferSize < FSE_NCountWriteBound(maxSymbolValue, tableLog))
        return FSE_writeNCount_generic(buffer, bufferSize, normalizedCounter, maxSymbolValue, tableLog, 0);

    return FSE_writeNCount_generic(buffer, bufferSize, normalizedCounter, maxSymbolValue, tableLog, 1 /* write in buffer is safe */);
}